

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  uint64_t c;
  uint64_t p4;
  uint64_t p3;
  uint64_t p2;
  uint64_t p1;
  uint64_t p0;
  uint64_t m6;
  uint64_t m5;
  uint64_t m4;
  uint64_t m3;
  uint64_t m2;
  uint64_t m1;
  uint64_t m0;
  uint64_t l [8];
  uint local_e0;
  ulong local_48;
  ulong local_40;
  
  uVar60 = a->d[0];
  uVar62 = a->d[1];
  uVar64 = a->d[2];
  uVar61 = b->d[0];
  uVar63 = b->d[1];
  uVar70 = b->d[2];
  uVar71 = b->d[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar60;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar61;
  uVar65 = SUB168(auVar1 * auVar17,8);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar65;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar60;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar63;
  auVar2 = auVar2 * auVar18;
  uVar72 = SUB168(auVar2 + auVar55,0);
  uVar77 = SUB168(auVar2 + auVar55,8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar62;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar61;
  uVar66 = SUB168(auVar3 * auVar19,8);
  uVar59 = SUB168(auVar3 * auVar19,0);
  uVar73 = uVar72 + uVar59;
  uVar59 = (ulong)CARRY8(uVar72,uVar59);
  uVar72 = uVar77 + uVar66;
  uVar78 = uVar72 + uVar59;
  uVar80 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar65,auVar2._0_8_)) +
           (ulong)(CARRY8(uVar77,uVar66) || CARRY8(uVar72,uVar59));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar60;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar70;
  uVar67 = SUB168(auVar4 * auVar20,8);
  uVar59 = SUB168(auVar4 * auVar20,0);
  uVar65 = uVar78 + uVar59;
  uVar59 = (ulong)CARRY8(uVar78,uVar59);
  uVar66 = uVar80 + uVar67;
  uVar81 = uVar66 + uVar59;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar62;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar63;
  uVar68 = SUB168(auVar5 * auVar21,8);
  uVar72 = SUB168(auVar5 * auVar21,0);
  uVar78 = uVar65 + uVar72;
  uVar72 = (ulong)CARRY8(uVar65,uVar72);
  uVar77 = uVar81 + uVar68;
  uVar82 = uVar77 + uVar72;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar64;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar61;
  uVar69 = SUB168(auVar6 * auVar22,8);
  uVar65 = SUB168(auVar6 * auVar22,0);
  uVar79 = uVar78 + uVar65;
  uVar65 = (ulong)CARRY8(uVar78,uVar65);
  uVar78 = uVar82 + uVar69;
  uVar83 = uVar78 + uVar65;
  uVar82 = (ulong)(CARRY8(uVar80,uVar67) || CARRY8(uVar66,uVar59)) +
           (ulong)(CARRY8(uVar81,uVar68) || CARRY8(uVar77,uVar72)) +
           (ulong)(CARRY8(uVar82,uVar69) || CARRY8(uVar78,uVar65));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar60;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar71;
  uVar68 = SUB168(auVar7 * auVar23,8);
  uVar60 = SUB168(auVar7 * auVar23,0);
  uVar65 = uVar83 + uVar60;
  uVar59 = (ulong)CARRY8(uVar83,uVar60);
  uVar66 = uVar82 + uVar68;
  uVar83 = uVar66 + uVar59;
  uVar60 = a->d[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar62;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar70;
  uVar69 = SUB168(auVar8 * auVar24,8);
  uVar72 = SUB168(auVar8 * auVar24,0);
  uVar78 = uVar65 + uVar72;
  uVar72 = (ulong)CARRY8(uVar65,uVar72);
  uVar77 = uVar83 + uVar69;
  uVar74 = uVar77 + uVar72;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar64;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar63;
  uVar80 = SUB168(auVar9 * auVar25,8);
  uVar65 = SUB168(auVar9 * auVar25,0);
  uVar67 = uVar78 + uVar65;
  uVar65 = (ulong)CARRY8(uVar78,uVar65);
  uVar78 = uVar74 + uVar80;
  uVar75 = uVar78 + uVar65;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar60;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar61;
  uVar81 = SUB168(auVar10 * auVar26,8);
  uVar61 = SUB168(auVar10 * auVar26,0);
  uVar84 = uVar67 + uVar61;
  uVar61 = (ulong)CARRY8(uVar67,uVar61);
  uVar67 = uVar75 + uVar81;
  uVar76 = uVar67 + uVar61;
  uVar68 = (ulong)(CARRY8(uVar82,uVar68) || CARRY8(uVar66,uVar59)) +
           (ulong)(CARRY8(uVar83,uVar69) || CARRY8(uVar77,uVar72)) +
           (ulong)(CARRY8(uVar74,uVar80) || CARRY8(uVar78,uVar65)) +
           (ulong)(CARRY8(uVar75,uVar81) || CARRY8(uVar67,uVar61));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar62;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar71;
  uVar66 = SUB168(auVar11 * auVar27,8);
  uVar62 = SUB168(auVar11 * auVar27,0);
  uVar72 = uVar76 + uVar62;
  uVar62 = (ulong)CARRY8(uVar76,uVar62);
  uVar59 = uVar68 + uVar66;
  uVar69 = uVar59 + uVar62;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar64;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar70;
  uVar77 = SUB168(auVar12 * auVar28,8);
  uVar61 = SUB168(auVar12 * auVar28,0);
  uVar65 = uVar72 + uVar61;
  uVar61 = (ulong)CARRY8(uVar72,uVar61);
  uVar72 = uVar69 + uVar77;
  uVar80 = uVar72 + uVar61;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar60;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar63;
  uVar78 = SUB168(auVar13 * auVar29,8);
  uVar63 = SUB168(auVar13 * auVar29,0);
  uVar67 = uVar65 + uVar63;
  uVar63 = (ulong)CARRY8(uVar65,uVar63);
  uVar65 = uVar80 + uVar78;
  uVar81 = uVar65 + uVar63;
  uVar72 = (ulong)(CARRY8(uVar68,uVar66) || CARRY8(uVar59,uVar62)) +
           (ulong)(CARRY8(uVar69,uVar77) || CARRY8(uVar72,uVar61)) +
           (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar65,uVar63));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar64;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar71;
  uVar59 = SUB168(auVar14 * auVar30,8);
  uVar62 = SUB168(auVar14 * auVar30,0);
  uVar63 = uVar81 + uVar62;
  uVar62 = (ulong)CARRY8(uVar81,uVar62);
  uVar61 = uVar72 + uVar59;
  uVar65 = uVar61 + uVar62;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar60;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar70;
  uVar70 = SUB168(auVar15 * auVar31,8);
  uVar64 = SUB168(auVar15 * auVar31,0);
  uVar68 = uVar63 + uVar64;
  uVar64 = (ulong)CARRY8(uVar63,uVar64);
  uVar63 = uVar65 + uVar70;
  auVar49._8_8_ =
       (ulong)(CARRY8(uVar72,uVar59) || CARRY8(uVar61,uVar62)) +
       (ulong)(CARRY8(uVar65,uVar70) || CARRY8(uVar63,uVar64));
  auVar49._0_8_ = uVar63 + uVar64;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar60;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar71;
  auVar49 = auVar16 * auVar32 + auVar49;
  local_48 = auVar49._0_8_;
  local_40 = auVar49._8_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = SUB168(auVar1 * auVar17,0);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar67;
  auVar50 = ZEXT816(0x402da1732fc9bebf) * auVar33 + auVar50;
  uVar60 = auVar50._8_8_;
  uVar64 = uVar60 + uVar73;
  uVar60 = (ulong)CARRY8(uVar60,uVar73);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar68;
  uVar70 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar34,8);
  uVar62 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar34,0);
  uVar63 = uVar64 + uVar62;
  uVar62 = (ulong)CARRY8(uVar64,uVar62);
  uVar61 = uVar60 + uVar70;
  uVar59 = uVar61 + uVar62;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar67;
  uVar71 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar35,8);
  uVar64 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar35,0);
  uVar69 = uVar63 + uVar64;
  uVar64 = (ulong)CARRY8(uVar63,uVar64);
  uVar63 = uVar59 + uVar71;
  uVar65 = uVar63 + uVar64;
  uVar72 = (ulong)(CARRY8(uVar60,uVar70) || CARRY8(uVar61,uVar62)) +
           (ulong)(CARRY8(uVar59,uVar71) || CARRY8(uVar63,uVar64));
  uVar64 = uVar65 + uVar79;
  uVar60 = (ulong)CARRY8(uVar65,uVar79);
  uVar65 = uVar72 + uVar60;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_48;
  uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar36,8);
  uVar62 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar36,0);
  uVar61 = uVar64 + uVar62;
  uVar62 = (ulong)CARRY8(uVar64,uVar62);
  uVar63 = uVar65 + uVar71;
  uVar66 = uVar63 + uVar62;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar68;
  uVar59 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar37,8);
  uVar64 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar37,0);
  uVar78 = uVar61 + uVar64;
  uVar64 = (ulong)CARRY8(uVar61,uVar64);
  uVar70 = uVar66 + uVar59;
  uVar77 = uVar70 + uVar64;
  uVar80 = uVar78 + uVar67;
  uVar61 = (ulong)CARRY8(uVar78,uVar67);
  uVar78 = uVar77 + uVar61;
  uVar66 = (ulong)CARRY8(uVar72,uVar60) + (ulong)(CARRY8(uVar65,uVar71) || CARRY8(uVar63,uVar62)) +
           (ulong)(CARRY8(uVar66,uVar59) || CARRY8(uVar70,uVar64)) + (ulong)CARRY8(uVar77,uVar61);
  uVar64 = uVar78 + uVar84;
  uVar60 = (ulong)CARRY8(uVar78,uVar84);
  uVar77 = uVar66 + uVar60;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_40;
  uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
  uVar62 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
  uVar61 = uVar64 + uVar62;
  uVar62 = (ulong)CARRY8(uVar64,uVar62);
  uVar63 = uVar77 + uVar71;
  uVar78 = uVar63 + uVar62;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_48;
  uVar59 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
  uVar64 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
  uVar72 = uVar61 + uVar64;
  uVar64 = (ulong)CARRY8(uVar61,uVar64);
  uVar70 = uVar78 + uVar59;
  uVar67 = uVar70 + uVar64;
  uVar65 = uVar72 + uVar68;
  uVar61 = (ulong)CARRY8(uVar72,uVar68);
  uVar72 = uVar67 + uVar61;
  uVar63 = (ulong)CARRY8(uVar66,uVar60) + (ulong)(CARRY8(uVar77,uVar71) || CARRY8(uVar63,uVar62)) +
           (ulong)(CARRY8(uVar78,uVar59) || CARRY8(uVar70,uVar64)) + (ulong)CARRY8(uVar67,uVar61);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_40;
  uVar61 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar40,8);
  uVar60 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar40,0);
  uVar62 = uVar72 + uVar60;
  uVar60 = (ulong)CARRY8(uVar72,uVar60);
  uVar64 = uVar63 + uVar61;
  uVar70 = uVar64 + uVar60;
  auVar56._8_8_ = uVar70;
  auVar56._0_8_ = uVar62;
  uVar68 = SUB168(auVar49 + auVar56,0);
  uVar62 = (ulong)CARRY8(uVar62,local_48);
  uVar59 = SUB168(auVar49 + auVar56,8);
  uVar72 = (ulong)(CARRY8(uVar63,uVar61) || CARRY8(uVar64,uVar60)) + (ulong)CARRY8(uVar70,uVar62) +
           (ulong)CARRY8(uVar70 + uVar62,local_40);
  auVar54._8_8_ = uVar72;
  auVar54._0_8_ = uVar59;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar50._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar68;
  auVar51 = ZEXT816(0x402da1732fc9bebf) * auVar41 + auVar51;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar51._0_8_;
  uVar60 = auVar51._8_8_;
  uVar64 = uVar60 + uVar69;
  uVar60 = (ulong)CARRY8(uVar60,uVar69);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar59;
  uVar70 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,8);
  uVar62 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,0);
  uVar63 = uVar64 + uVar62;
  uVar62 = (ulong)CARRY8(uVar64,uVar62);
  uVar61 = uVar60 + uVar70;
  uVar66 = uVar61 + uVar62;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar68;
  uVar71 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,8);
  uVar64 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,0);
  uVar69 = uVar63 + uVar64;
  uVar64 = (ulong)CARRY8(uVar63,uVar64);
  uVar63 = uVar66 + uVar71;
  uVar77 = uVar63 + uVar64;
  uVar66 = (ulong)(CARRY8(uVar60,uVar70) || CARRY8(uVar61,uVar62)) +
           (ulong)(CARRY8(uVar66,uVar71) || CARRY8(uVar63,uVar64));
  uVar64 = uVar77 + uVar80;
  uVar60 = (ulong)CARRY8(uVar77,uVar80);
  uVar77 = uVar66 + uVar60;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar72;
  uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar44,8);
  uVar62 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar44,0);
  uVar61 = uVar64 + uVar62;
  uVar62 = (ulong)CARRY8(uVar64,uVar62);
  uVar63 = uVar77 + uVar71;
  uVar78 = uVar63 + uVar62;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar59;
  uVar59 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar45,8);
  uVar64 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar45,0);
  uVar80 = uVar61 + uVar64;
  uVar64 = (ulong)CARRY8(uVar61,uVar64);
  uVar70 = uVar78 + uVar59;
  uVar67 = uVar70 + uVar64;
  uVar81 = uVar80 + uVar68;
  uVar61 = (ulong)CARRY8(uVar80,uVar68);
  uVar68 = uVar67 + uVar61;
  auVar52._8_8_ =
       (ulong)CARRY8(uVar66,uVar60) + (ulong)(CARRY8(uVar77,uVar71) || CARRY8(uVar63,uVar62)) +
       (ulong)(CARRY8(uVar78,uVar59) || CARRY8(uVar70,uVar64)) + (ulong)CARRY8(uVar67,uVar61) +
       (ulong)CARRY8(uVar68,uVar65);
  auVar52._0_8_ = uVar68 + uVar65;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar72;
  auVar54 = ZEXT816(0x4551231950b75fc4) * auVar46 + auVar52 + auVar54;
  uVar62 = auVar54._0_8_;
  uVar64 = auVar54._8_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar64;
  auVar57 = ZEXT816(0x402da1732fc9bebf) * auVar47 + auVar57;
  uVar60 = auVar57._8_8_;
  r->d[0] = auVar57._0_8_;
  auVar53[8] = CARRY8(uVar60,uVar69);
  auVar53._0_8_ = uVar60 + uVar69;
  auVar53._9_7_ = 0;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar64;
  auVar53 = ZEXT816(0x4551231950b75fc4) * auVar48 + auVar53;
  uVar60 = auVar53._8_8_;
  r->d[1] = auVar53._0_8_;
  uVar61 = uVar60 + uVar64;
  uVar60 = (ulong)CARRY8(uVar60,uVar64) + (ulong)CARRY8(uVar61,uVar81);
  r->d[2] = uVar61 + uVar81;
  r->d[3] = uVar60 + uVar62;
  local_e0 = (uint)CARRY8(uVar60,uVar62);
  iVar58 = secp256k1_scalar_check_overflow(r);
  secp256k1_scalar_reduce(r,local_e0 + iVar58);
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint64_t l[8];
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);

    SECP256K1_SCALAR_VERIFY(r);
}